

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber
              (RecyclableObject *function,CallInfo callInfo,...)

{
  int iVar1;
  int iVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  UNumberFormatFields field;
  BOOL BVar8;
  charcount_t cVar9;
  charcount_t cVar10;
  undefined4 *puVar11;
  Var pvVar12;
  DynamicObject *pDVar13;
  JavascriptBoolean *pJVar14;
  JavascriptArray *pJVar15;
  Recycler *pRVar16;
  char16 *pcVar17;
  Recycler *pRVar18;
  LPCSTR pCVar19;
  JavascriptString *pJVar20;
  size_t sVar21;
  uint uVar22;
  uint in_stack_00000010;
  undefined1 local_a8 [8];
  NumberFormatPartsBuilder nfpb;
  long lStack_78;
  UErrorCode status;
  Var cachedUNumberFormat;
  Arguments args;
  int partEnd;
  double local_48;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_40;
  ScopedUFieldPositionIterator fpi;
  int partStart;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  uVar22 = callInfo._0_4_;
  if (in_stack_00000010 != uVar22) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  cachedUNumberFormat = (Var)callInfo;
  if ((uVar22 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x958,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar22 & 0xffffff) == 5) {
    pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,1);
    if (((ulong)pvVar12 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar12 & 0xffff000000000000) != 0x1000000000000) {
      if ((((ulong)pvVar12 & 0xffff000000000000) != 0x1000000000000) &&
         (pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,1),
         (ulong)pvVar12 >> 0x32 == 0)) goto LAB_00b52010;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_00b52c83;
      *puVar11 = 0;
    }
    pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,2);
    bVar6 = DynamicObject::IsBaseDynamicObject(pvVar12);
    if (!bVar6) goto LAB_00b52010;
    pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,3);
    bVar6 = VarIs<Js::JavascriptBoolean>(pvVar12);
    if (!bVar6) goto LAB_00b52010;
    pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,4);
    bVar6 = VarIs<Js::JavascriptBoolean>(pvVar12);
    if (!bVar6) goto LAB_00b52010;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x958,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar6) goto LAB_00b52c83;
      *puVar11 = 0;
    }
LAB_00b52010:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x961,
                                "((args.Info.Count == 5 && (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) && DynamicObject::IsBaseDynamicObject(args[2]) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,1);
  if (((ulong)pvVar12 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar12 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b520ea;
    if ((ulong)pvVar12 >> 0x32 == 0) {
      local_48 = JavascriptConversion::ToNumber_Full(pvVar12,pSVar3);
    }
    else {
      local_48 = (double)((ulong)pvVar12 ^ 0xfffc000000000000);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
LAB_00b520ea:
    local_48 = (double)(int)pvVar12;
  }
  pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,2);
  pDVar13 = UnsafeVarTo<Js::DynamicObject>(pvVar12);
  pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,3);
  pJVar14 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar12);
  iVar1 = pJVar14->value;
  pvVar12 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,4);
  pJVar14 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar12);
  iVar2 = pJVar14->value;
  lStack_78 = 0;
  iVar7 = (*(pDVar13->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])
                    (pDVar13,pDVar13,10,&stack0xffffffffffffff88,0,pSVar3);
  if (iVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x968,
                                "(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext))"
                                ,
                                "state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, __null, scriptContext)"
                               );
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  if (iVar2 == 0) {
    if (iVar1 != 0) {
      Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.formatToParts(%f)\n",local_48,
                    "EntryIntl_FormatNumber");
      goto LAB_00b52229;
    }
    Output::Trace(IntlPhase,L"%S(): Calling NumberFormat.prototype.format(%f)\n",local_48,
                  "EntryIntl_FormatNumber");
  }
  else {
    Output::Trace(IntlPhase,L"%S(): Calling %f.toLocaleString(...)\n",local_48,
                  "EntryIntl_FormatNumber");
    if (iVar1 != 0) {
LAB_00b52229:
      lVar5 = lStack_78;
      nfpb.fields.ptr._4_4_ = 0;
      local_40.object = (UFieldPositionIterator *)ufieldpositer_open_70();
      pRVar18 = pSVar3->recycler;
      fpi.object._4_4_ = 0;
      local_a8 = (undefined1  [8])&char16_t::typeinfo;
      nfpb.num = 0.0;
      nfpb.formatted.ptr = (char16_t *)&DAT_00000008;
      nfpb._16_8_ = anon_var_dwarf_66fc5bd;
      nfpb.sc.ptr._0_4_ = 0x159;
      pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar18,(TrackAllocData *)local_a8);
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
      }
      pcVar17 = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar16,0x10);
      if (pcVar17 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
      }
      cVar9 = unum_formatDoubleForFields_70
                        (local_48,*(undefined8 *)(lVar5 + 8),pcVar17,8,local_40.object,
                         (undefined1 *)((long)&fpi.object + 4));
      if ((int)cVar9 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x15b,
                                    "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)"
                                    ,
                                    "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0"
                                   );
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
      }
      if ((fpi.object._4_4_ == 0xf) || (fpi.object._4_4_ == -0x7c)) {
        if ((int)cVar9 < 8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x15e,"(*returnLength >= firstTryLength)",
                                      "Executor reported buffer failure but did not require additional space"
                                     );
          if (!bVar6) goto LAB_00b52c83;
          *puVar11 = 0;
        }
        uVar22 = cVar9 + 1;
        Output::Trace(IntlPhase,
                      L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n"
                      ,"EnsureBuffer",8,(ulong)uVar22);
        fpi.object._4_4_ = 0;
        local_a8 = (undefined1  [8])&char16_t::typeinfo;
        nfpb.num = 0.0;
        nfpb._16_8_ = anon_var_dwarf_66fc5bd;
        nfpb.sc.ptr._0_4_ = 0x162;
        nfpb.formatted.ptr = (char16_t *)(long)(int)uVar22;
        pRVar18 = Memory::Recycler::TrackAllocInfo(pRVar18,(TrackAllocData *)local_a8);
        if (uVar22 == 0) {
          pcVar17 = (char16 *)&DAT_00000008;
          Memory::Recycler::ClearTrackAllocInfo(pRVar18,(TrackAllocData *)0x0);
        }
        else {
          sVar21 = 0xffffffffffffffff;
          if (-1 < (int)uVar22) {
            sVar21 = (long)(int)uVar22 * 2;
          }
          BVar8 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar8 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar6) goto LAB_00b52c83;
            *puVar11 = 0;
          }
          pcVar17 = (char16 *)
                    Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (pRVar18,sVar21);
          if (pcVar17 == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar6) goto LAB_00b52c83;
            *puVar11 = 0;
            pcVar17 = (char16 *)0x0;
          }
        }
        cVar10 = unum_formatDoubleForFields_70
                           (local_48,*(undefined8 *)(lVar5 + 8),pcVar17,uVar22,local_40.object,
                            (undefined1 *)((long)&fpi.object + 4));
        if (cVar10 != cVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x164,"(*returnLength == secondTryLength - 1)",
                                      "Second try of executor returned unexpected length");
          cVar9 = cVar10;
          goto joined_r0x00b52689;
        }
      }
      else if (7 < (int)cVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x168,"(*returnLength < firstTryLength)",
                                    "Executor required additional length but reported successful status"
                                   );
joined_r0x00b52689:
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
      }
      if (fpi.object._4_4_ < 1 && fpi.object._4_4_ != -0x7c) {
LAB_00b52706:
        NumberFormatPartsBuilder::NumberFormatPartsBuilder
                  ((NumberFormatPartsBuilder *)local_a8,local_48,pcVar17,cVar9,pSVar3);
        fpi.object._4_4_ = 0;
        args.Values._4_4_ = 0;
        field = ufieldpositer_next_70(local_40.object);
        while (-1 < (int)field) {
          NumberFormatPartsBuilder::InsertPart
                    ((NumberFormatPartsBuilder *)local_a8,field,fpi.object._4_4_,args.Values._4_4_);
          field = ufieldpositer_next_70
                            (local_40.object,(undefined1 *)((long)&fpi.object + 4),
                             (undefined1 *)((long)&args.Values + 4));
        }
        pJVar15 = NumberFormatPartsBuilder::ToPartsArray((NumberFormatPartsBuilder *)local_a8);
        PlatformAgnostic::ICUHelpers::
        ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>::~ScopedICUObject
                  (&local_40);
        return pJVar15;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      pCVar19 = (LPCSTR)u_errorName_70(fpi.object._4_4_);
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x16b,
                                  "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                  ,pCVar19);
      if (bVar6) {
        *puVar11 = 0;
        goto LAB_00b52706;
      }
      goto LAB_00b52c83;
    }
  }
  lVar5 = lStack_78;
  pRVar18 = pSVar3->recycler;
  local_40.object = (UFieldPositionIterator *)((ulong)local_40.object._4_4_ << 0x20);
  local_a8 = (undefined1  [8])&char16_t::typeinfo;
  nfpb.num = 0.0;
  nfpb.formatted.ptr = (char16_t *)&DAT_00000008;
  nfpb._16_8_ = anon_var_dwarf_66fc5bd;
  nfpb.sc.ptr._0_4_ = 0x159;
  pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar18,(TrackAllocData *)local_a8);
  BVar8 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar8 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  pcVar17 = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar16,0x10);
  if (pcVar17 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  cVar9 = unum_formatDouble_70(local_48,*(undefined8 *)(lVar5 + 8),pcVar17,8,0,&local_40);
  if ((int)cVar9 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  if (((int)local_40.object == 0xf) || ((int)local_40.object == -0x7c)) {
    if ((int)cVar9 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar6) goto LAB_00b52c83;
      *puVar11 = 0;
    }
    uVar22 = cVar9 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar22);
    local_40.object = local_40.object & 0xffffffff00000000;
    local_a8 = (undefined1  [8])&char16_t::typeinfo;
    nfpb.num = 0.0;
    nfpb._16_8_ = anon_var_dwarf_66fc5bd;
    nfpb.sc.ptr._0_4_ = 0x162;
    nfpb.formatted.ptr = (char16_t *)(long)(int)uVar22;
    pRVar18 = Memory::Recycler::TrackAllocInfo(pRVar18,(TrackAllocData *)local_a8);
    if (cVar9 == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar18,(TrackAllocData *)0x0);
      pcVar17 = (char16 *)&DAT_00000008;
    }
    else {
      sVar21 = 0xffffffffffffffff;
      if (-1 < (int)uVar22) {
        sVar21 = (long)(int)uVar22 * 2;
      }
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
      }
      pcVar17 = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar18,sVar21);
      if (pcVar17 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) goto LAB_00b52c83;
        *puVar11 = 0;
        pcVar17 = (char16 *)0x0;
      }
    }
    cVar10 = unum_formatDouble_70(local_48,*(undefined8 *)(lVar5 + 8),pcVar17,uVar22,0,&local_40);
    if (cVar10 != cVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cVar9 = cVar10;
      goto joined_r0x00b52be6;
    }
  }
  else if (7 < (int)cVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b52be6:
    if (!bVar6) goto LAB_00b52c83;
    *puVar11 = 0;
  }
  if (0 < (int)local_40.object || (int)local_40.object == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    pCVar19 = (LPCSTR)u_errorName_70((ulong)local_40.object & 0xffffffff);
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar19);
    if (!bVar6) {
LAB_00b52c83:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  pJVar20 = JavascriptString::NewWithBuffer(pcVar17,cVar9,pSVar3);
  return pJVar20;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatNumber(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1])) &&
            DynamicObject::IsBaseDynamicObject(args[2]) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        double num = JavascriptConversion::ToNumber(args[1], scriptContext);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[2]);
        bool toParts = UnsafeVarTo<JavascriptBoolean>(args[3])->GetValue();
        bool forNumberPrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        Var cachedUNumberFormat = nullptr; // cached by EntryIntl_CacheNumberFormat
        AssertOrFailFast(state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, NULL, scriptContext));

        if (forNumberPrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Prototype_toLocaleString);
            INTL_TRACE("Calling %f.toLocaleString(...)", num);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_formatToParts);
            INTL_TRACE("Calling NumberFormat.prototype.formatToParts(%f)", num);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(NumberFormat_Prototype_format);
            INTL_TRACE("Calling NumberFormat.prototype.format(%f)", num);
        }

        auto fmt = static_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
        char16 *formatted = nullptr;
        int formattedLen = 0;

        if (!toParts)
        {
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen);

            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

#if defined(ICU_VERSION) && ICU_VERSION >= 61
        UErrorCode status = U_ZERO_ERROR;
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));

        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDoubleForFields(*fmt, num, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);

        NumberFormatPartsBuilder nfpb(num, formatted, formattedLen, scriptContext);

        int partStart = 0;
        int partEnd = 0;
        int i = 0;
        for (int kind = ufieldpositer_next(fpi, &partStart, &partEnd); kind >= 0; kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i)
        {
            nfpb.InsertPart(static_cast<UNumberFormatFields>(kind), partStart, partEnd);
        }

        return nfpb.ToPartsArray();
#else
        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray *ret = library->CreateArray(1);
        DynamicObject* part = library->CreateObject();
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*fmt, num, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen);
        JavascriptOperators::InitProperty(part, PropertyIds::type, library->GetIntlUnknownPartString());
        JavascriptOperators::InitProperty(part, PropertyIds::value, JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext));

        ret->SetItem(0, part, PropertyOperationFlags::PropertyOperation_None);
        return ret;
#endif // #if ICU_VERSION >= 61 ... #else
#else
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) &&
            DynamicObject::IsBaseDynamicObject(args.Values[2])
        );

        DynamicObject *options = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(options->GetInternalProperty(options, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatNumber: Could not retrieve hiddenObject.");
        DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();

        NumberFormatting::INumberFormatter *numberFormatter;
        numberFormatter = static_cast<NumberFormatting::INumberFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());

        AutoHSTRING result;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            IfFailThrowHr(numberFormatter->FormatInt(TaggedInt::ToInt32(args.Values[1]), &result));
        }
        else
        {
            IfFailThrowHr(numberFormatter->FormatDouble(JavascriptNumber::GetValue(args.Values[1]), &result));
        }

        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*result, NULL);

        if (strBuf == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            JavascriptStringObject *retVal = scriptContext->GetLibrary()->CreateStringObject(Js::JavascriptString::NewCopySz(strBuf, scriptContext));
            return retVal;
        }
#endif
    }